

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_34;
  
  discharge2reg(fs,e,reg);
  if (e->k == VJMP) {
    luaK_concat(fs,&e->t,(e->u).info);
  }
  iVar3 = e->f;
  if (e->t == iVar3) goto LAB_0011bb99;
  iVar2 = need_value(fs,e->t);
  if (iVar2 == 0) {
    iVar2 = need_value(fs,iVar3);
    if (iVar2 != 0) goto LAB_0011baf5;
    local_34 = -1;
    iVar2 = -1;
  }
  else {
LAB_0011baf5:
    iVar3 = -1;
    if (e->k != VJMP) {
      iVar3 = luaK_code(fs,0x7fffff38);
    }
    fs->lasttarget = fs->pc;
    iVar2 = luaK_code(fs,reg * 0x80 + 6);
    fs->lasttarget = fs->pc;
    local_34 = luaK_code(fs,reg * 0x80 | 7);
    iVar1 = fs->pc;
    fs->lasttarget = iVar1;
    patchlistaux(fs,iVar3,iVar1,0xff,iVar1);
    iVar3 = e->f;
  }
  iVar1 = fs->pc;
  fs->lasttarget = iVar1;
  patchlistaux(fs,iVar3,iVar1,reg,iVar2);
  patchlistaux(fs,e->t,iVar1,reg,local_34);
LAB_0011bb99:
  e->t = -1;
  e->f = -1;
  (e->u).info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void exp2reg (FuncState *fs, expdesc *e, int reg) {
  discharge2reg(fs, e, reg);
  if (e->k == VJMP)  /* expression itself is a test? */
    luaK_concat(fs, &e->t, e->u.info);  /* put this jump in 't' list */
  if (hasjumps(e)) {
    int final;  /* position after whole expression */
    int p_f = NO_JUMP;  /* position of an eventual LOAD false */
    int p_t = NO_JUMP;  /* position of an eventual LOAD true */
    if (need_value(fs, e->t) || need_value(fs, e->f)) {
      int fj = (e->k == VJMP) ? NO_JUMP : luaK_jump(fs);
      p_f = code_loadbool(fs, reg, OP_LFALSESKIP);  /* skip next inst. */
      p_t = code_loadbool(fs, reg, OP_LOADTRUE);
      /* jump around these booleans if 'e' is not a test */
      luaK_patchtohere(fs, fj);
    }
    final = luaK_getlabel(fs);
    patchlistaux(fs, e->f, final, reg, p_f);
    patchlistaux(fs, e->t, final, reg, p_t);
  }
  e->f = e->t = NO_JUMP;
  e->u.info = reg;
  e->k = VNONRELOC;
}